

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O2

char * phone_num_to_string(char *string_buf,size_t string_buf_len,uint8_t *num_buf,
                          size_t num_buf_len)

{
  char *pcVar1;
  char *pstr;
  byte *pbVar2;
  byte *pbVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  
  pcVar1 = string_buf;
  pbVar2 = (byte *)(string_buf + 1);
  sVar6 = 0;
  uVar4 = 1;
  do {
    if (num_buf_len == sVar6) break;
    pbVar3 = (byte *)string_buf;
    if (num_buf[sVar6] >> 4 == 0xe) goto LAB_001049ca;
    pbVar2[-1] = num_buf[sVar6] >> 4 | 0x30;
    if (string_buf_len - 1 <= uVar4) {
      pbVar3 = (byte *)string_buf + 1;
      goto LAB_001049ca;
    }
    pbVar3 = pbVar2;
    if ((num_buf[sVar6] & 0xf) == 0xe) goto LAB_001049ca;
    string_buf = (char *)((byte *)string_buf + 2);
    *pbVar2 = num_buf[sVar6] & 0xf | 0x30;
    sVar6 = sVar6 + 1;
    pbVar2 = pbVar2 + 2;
    uVar5 = uVar4 + 1;
    uVar4 = uVar4 + 2;
  } while (uVar5 < string_buf_len - 1);
  pbVar3 = pbVar2 + -1;
LAB_001049ca:
  *pbVar3 = 0;
  return pcVar1;
}

Assistant:

extern char* phone_num_to_string(char *string_buf, size_t string_buf_len, uint8_t *num_buf, size_t num_buf_len) {
    char  *pstr = string_buf;
    size_t i, j;

    j = 0;

    for (i = 0; i < num_buf_len; i++) {
        int pn_digit = num_buf[i] >> 4;

        if (pn_digit == 0xe) break;
        *pstr++ = (pn_digit) + '0';
        j++;

        if (j >= (string_buf_len - 1)) break;

        pn_digit = num_buf[i] & 0x0f;

        if (pn_digit == 0xe) break;
        *pstr++ = (pn_digit) + '0';
        j++;

        if (j >= (string_buf_len - 1)) break;
    }

    *pstr = '\0';
    return string_buf;
}